

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

ssize_t cf_h2_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t len,CURLcode *err)

{
  h1_req_parser *parser;
  cf_h2_ctx *ctx;
  HTTP *pHVar1;
  curl_off_t cVar2;
  ulong uVar3;
  ulong uVar4;
  _Bool _Var5;
  uint uVar6;
  int32_t iVar7;
  uint uVar8;
  int iVar9;
  CURLcode CVar10;
  nghttp2_nv *nva;
  undefined4 extraout_var;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  ssize_t sVar16;
  bool bVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  nghttp2_session *session;
  nghttp2_data_provider *data_prd_00;
  Curl_easy *pCVar23;
  stream_ctx *psVar24;
  size_t *psVar25;
  ulong local_e0;
  size_t nheader;
  stream_ctx *stream;
  nghttp2_priority_spec local_84;
  dynhds h2_headers;
  nghttp2_data_provider data_prd;
  
  ctx = (cf_h2_ctx *)cf->ctx;
  local_e0 = len;
  if ((data == (Curl_easy *)0x0) || (pHVar1 = (data->req).p.http, pHVar1 == (HTTP *)0x0)) {
    pCVar23 = (ctx->call_data).data;
    (ctx->call_data).data = data;
LAB_00600cb1:
    stream = (stream_ctx *)0x0;
    Curl_dynhds_init(&h2_headers,0,0x100000);
    CVar10 = http2_data_setup((Curl_cfilter *)cf->ctx,data,&stream);
    psVar24 = stream;
    *err = CVar10;
    if (CVar10 != CURLE_OK) goto LAB_00600ceb;
    parser = &stream->h1;
    uVar18 = Curl_h1_req_parse_read(parser,(char *)buf,len,(char *)0x0,0,err);
    local_e0 = uVar18;
    if (((long)uVar18 < 0) || ((psVar24->h1).done != true)) {
LAB_00600cf4:
      nva = (nghttp2_nv *)0x0;
      if (data != (Curl_easy *)0x0) goto LAB_00600d06;
    }
    else {
      CVar10 = Curl_http_req_to_h2(&h2_headers,parser->req,data);
      *err = CVar10;
      if (CVar10 != CURLE_OK) {
LAB_00600ceb:
        local_e0 = 0xffffffffffffffff;
        goto LAB_00600cf4;
      }
      Curl_h1_req_parse_free(parser);
      nva = Curl_dynhds_to_nva(&h2_headers,&nheader);
      if (nva == (nghttp2_nv *)0x0) {
        *err = CURLE_OUT_OF_MEMORY;
        goto LAB_00600ceb;
      }
      h2_pri_spec(data,&local_84);
      iVar9 = nghttp2_session_check_request_allowed(ctx->h2);
      if ((((data != (Curl_easy *)0x0) && (iVar9 == 0)) && (((data->set).field_0x8bd & 0x10) != 0))
         && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"send request NOT allowed (via nghttp2)");
      }
      if ((byte)((data->state).httpreq - 1) < 4) {
        psVar24->upload_left = (data->state).infilesize;
        data_prd_00 = &data_prd;
        data_prd.read_callback = req_body_read_callback;
        data_prd.source.ptr = (void *)0x0;
        session = ctx->h2;
      }
      else {
        psVar24->upload_left = 0;
        session = ctx->h2;
        data_prd_00 = (nghttp2_data_provider *)0x0;
      }
      uVar6 = nghttp2_submit_request(session,&local_84,nva,nheader,data_prd_00,data);
      uVar8 = (uint)*(undefined8 *)&(data->set).field_0x8ba;
      if ((int)uVar6 < 0) {
        if (((uVar8 >> 0x1c & 1) != 0) && (0 < cf->cft->log_level)) {
          pcVar15 = nghttp2_strerror(uVar6);
          Curl_trc_cf_infof(data,cf,"send: nghttp2_submit_request error (%s)%u",pcVar15,(ulong)uVar6
                           );
        }
        *err = CURLE_SEND_ERROR;
        local_e0 = 0xffffffffffffffff;
      }
      else {
        if (((uVar8 >> 0x1c & 1) != 0) &&
           (Curl_infof(data,"[HTTP/2] [%d] OPENED stream for %s",(ulong)uVar6,(data->state).url),
           nheader != 0)) {
          psVar25 = &nva->valuelen;
          uVar22 = 0;
          uVar21 = 0;
          uVar19 = nheader;
          do {
            uVar3 = psVar25[-1];
            uVar4 = *psVar25;
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"[HTTP/2] [%d] [%.*s: %.*s]",(ulong)uVar6,uVar3 & 0xffffffff,
                         ((nghttp2_nv *)(psVar25 + -3))->name,uVar4 & 0xffffffff,
                         (uint8_t *)psVar25[-2]);
              uVar19 = nheader;
            }
            uVar22 = uVar22 + uVar3 + uVar4;
            uVar21 = uVar21 + 1;
            psVar25 = psVar25 + 5;
          } while (uVar21 < uVar19);
          if ((60000 < uVar22) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,
                       "[HTTP/2] Warning: The cumulative length of all headers exceeds %d bytes and that could cause the stream to be rejected."
                       ,60000);
          }
        }
        psVar24->id = uVar6;
        psVar24->local_window_size = 0xa00000;
        lVar14 = (data->set).max_recv_speed;
        if (lVar14 != 0) {
          lVar20 = lVar14 + 0x3ffe;
          if (-1 < lVar14 + -1) {
            lVar20 = lVar14 + -1;
          }
          lVar20 = lVar20 >> 0xe;
          lVar13 = 1;
          if (0xc000 < lVar14) {
            lVar13 = (lVar20 - (lVar20 + 1 >> 0x3f)) + 1 >> 1;
          }
          lVar14 = lVar13 + lVar20 + 1;
          if (lVar14 < 0x280) {
            psVar24->local_window_size = (int)lVar14 << 0xe;
          }
        }
        local_e0 = len;
        if (len - uVar18 != 0) {
          sVar16 = Curl_bufq_write(&psVar24->sendbuf,(uchar *)((long)buf + uVar18),len - uVar18,err)
          ;
          if (sVar16 < 0) {
            *err = CURLE_SEND_ERROR;
            local_e0 = 0xffffffffffffffff;
          }
          else {
            local_e0 = uVar18 + sVar16;
          }
        }
      }
LAB_00600d06:
      if (((cf != (Curl_cfilter *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0))
         && (0 < cf->cft->log_level)) {
        if (stream == (stream_ctx *)0x0) {
          uVar18 = 0xffffffff;
        }
        else {
          uVar18 = (ulong)(uint)stream->id;
        }
        Curl_trc_cf_infof(data,cf,"[%d] submit -> %zd, %d",uVar18,local_e0,(ulong)*err);
      }
    }
    (*Curl_cfree)(nva);
    psVar24 = stream;
    Curl_dynhds_free(&h2_headers);
    if ((long)local_e0 < 0) {
LAB_0060104d:
      if (psVar24 == (stream_ctx *)0x0) {
        if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
           (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
          CVar10 = *err;
          uVar6 = nghttp2_session_get_remote_window_size(ctx->h2);
          sVar11 = Curl_bufq_len(&ctx->outbufq);
          Curl_trc_cf_infof(data,cf,
                            "cf_send(len=%zu) -> %zd, %d, connection-window=%d, nw_send_buffer(%zu)"
                            ,len,local_e0,CVar10,(ulong)uVar6,sVar11);
        }
        goto LAB_0060125a;
      }
    }
    else {
      CVar10 = h2_progress_egress(cf,data);
      if (psVar24 == (stream_ctx *)0x0) {
        bVar17 = true;
        psVar24 = (stream_ctx *)0x0;
LAB_00600f11:
        if (CVar10 == CURLE_OK) {
          if (!bVar17) {
            _Var5 = Curl_bufq_is_empty(&psVar24->sendbuf);
            bVar17 = !_Var5;
            goto LAB_00600f50;
          }
LAB_00601007:
          iVar9 = should_close_session(ctx);
          if (iVar9 == 0) goto LAB_0060104d;
          if (psVar24->closed != true) {
            if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
               (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level))
               )) {
              Curl_trc_cf_infof(data,cf,"send: nothing to do in this session");
            }
            *err = CURLE_HTTP2;
            goto LAB_00601180;
          }
          local_e0 = http2_handle_stream_close(cf,data,psVar24,err);
        }
        else {
          bVar17 = true;
          if (CVar10 != CURLE_AGAIN) {
            *err = CVar10;
            local_e0 = 0xffffffffffffffff;
            goto LAB_0060104d;
          }
LAB_00600f50:
          if ((((long)local_e0 < 1) || (psVar24 == (stream_ctx *)0x0)) || (!bVar17))
          goto LAB_00601007;
          iVar7 = nghttp2_session_get_stream_remote_window_size(ctx->h2,psVar24->id);
          psVar24->upload_blocked_len = local_e0;
          if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
              ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level))
          {
            uVar6 = psVar24->id;
            uVar8 = nghttp2_session_get_remote_window_size(ctx->h2);
            Curl_trc_cf_infof(data,cf,"[%d] cf_send(len=%zu) BLOCK: win %u/%zu blocked_len=%zu",
                              (ulong)uVar6,len,(ulong)uVar8,(long)iVar7,local_e0);
          }
          *err = CURLE_AGAIN;
          local_e0 = 0xffffffffffffffff;
        }
      }
      else {
        if (psVar24->closed == false) {
          bVar17 = false;
          goto LAB_00600f11;
        }
        if (data != (Curl_easy *)0x0) goto LAB_00600ecd;
LAB_00600eeb:
        *err = CURLE_SEND_ERROR;
LAB_00601180:
        local_e0 = 0xffffffffffffffff;
      }
    }
    if (data == (Curl_easy *)0x0) goto LAB_0060125a;
  }
  else {
    psVar24 = (stream_ctx *)pHVar1->h2_ctx;
    pCVar23 = (ctx->call_data).data;
    (ctx->call_data).data = data;
    if ((psVar24 == (stream_ctx *)0x0) || (psVar24->id == 0xffffffff)) goto LAB_00600cb1;
    uVar18 = psVar24->upload_blocked_len;
    if (uVar18 != 0) {
      if (len < uVar18) {
        Curl_failf(data,"HTTP/2 send again with decreased length (%zd vs %zd)",len,uVar18);
        CVar10 = CURLE_HTTP2;
        local_e0 = 0xffffffffffffffff;
        goto LAB_00601354;
      }
      psVar24->upload_blocked_len = 0;
      local_e0 = uVar18;
LAB_006012b8:
      _Var5 = Curl_bufq_is_empty(&psVar24->sendbuf);
      if (!_Var5) {
        iVar9 = nghttp2_session_resume_data(ctx->h2,psVar24->id);
        iVar9 = nghttp2_is_fatal(iVar9);
        if (iVar9 != 0) {
          CVar10 = CURLE_SEND_ERROR;
          local_e0 = 0xffffffffffffffff;
          goto LAB_00601354;
        }
      }
      CVar10 = h2_progress_egress(cf,data);
      bVar17 = false;
      if ((uVar18 == 0) && (psVar24->closed != false)) {
LAB_00600ecd:
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"stream %u closed",(ulong)(uint)psVar24->id);
        }
        goto LAB_00600eeb;
      }
      goto LAB_00600f11;
    }
    if (psVar24->closed == true) {
      uVar6 = (uint)*(undefined8 *)&(data->set).field_0x8ba;
      if (psVar24->resp_hds_complete == true) {
        CVar10 = CURLE_OK;
        if ((uVar6 >> 0x1c & 1) != 0) {
          if (cf->cft->log_level < 1) goto LAB_00601354;
          Curl_trc_cf_infof(data,cf,"[%d] discarding dataon closed stream with response");
        }
        CVar10 = CURLE_OK;
      }
      else {
        local_e0 = 0xffffffffffffffff;
        CVar10 = CURLE_SEND_ERROR;
        if ((uVar6 >> 0x1c & 1) != 0) {
          Curl_infof(data,"stream %u closed",(ulong)(uint)psVar24->id);
          local_e0 = 0xffffffffffffffff;
        }
      }
LAB_00601354:
      *err = CVar10;
    }
    else {
      local_e0 = Curl_bufq_write(&psVar24->sendbuf,(uchar *)buf,len,err);
      if ((-1 < (long)local_e0) || (*err == CURLE_AGAIN)) goto LAB_006012b8;
    }
  }
  if (((cf != (Curl_cfilter *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
     (0 < cf->cft->log_level)) {
    uVar6 = psVar24->id;
    CVar10 = *err;
    cVar2 = psVar24->upload_left;
    iVar7 = nghttp2_session_get_stream_remote_window_size(ctx->h2,uVar6);
    uVar8 = nghttp2_session_get_remote_window_size(ctx->h2);
    sVar11 = Curl_bufq_len(&psVar24->sendbuf);
    sVar12 = Curl_bufq_len(&ctx->outbufq);
    Curl_trc_cf_infof(data,cf,
                      "[%d] cf_send(len=%zu) -> %zd, %d, upload_left=%ld, h2 windows %d-%d (stream-conn), buffers %zu-%zu (stream-conn)"
                      ,(ulong)uVar6,len,local_e0,(ulong)CVar10,cVar2,CONCAT44(extraout_var,iVar7),
                      (ulong)uVar8,sVar11,sVar12);
  }
LAB_0060125a:
  *(Curl_easy **)((long)cf->ctx + 0x10) = pCVar23;
  return local_e0;
}

Assistant:

static ssize_t cf_h2_send(struct Curl_cfilter *cf, struct Curl_easy *data,
                          const void *buf, size_t len, CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  struct cf_call_data save;
  int rv;
  ssize_t nwritten;
  CURLcode result;
  int blocked = 0, was_blocked = 0;

  CF_DATA_SAVE(save, cf, data);

  if(stream && stream->id != -1) {
    if(stream->upload_blocked_len) {
      /* the data in `buf` has already been submitted or added to the
       * buffers, but have been EAGAINed on the last invocation. */
      /* TODO: this assertion triggers in OSSFuzz runs and it is not
       * clear why. Disable for now to let OSSFuzz continue its tests. */
      DEBUGASSERT(len >= stream->upload_blocked_len);
      if(len < stream->upload_blocked_len) {
        /* Did we get called again with a smaller `len`? This should not
         * happen. We are not prepared to handle that. */
        failf(data, "HTTP/2 send again with decreased length (%zd vs %zd)",
              len, stream->upload_blocked_len);
        *err = CURLE_HTTP2;
        nwritten = -1;
        goto out;
      }
      nwritten = (ssize_t)stream->upload_blocked_len;
      stream->upload_blocked_len = 0;
      was_blocked = 1;
    }
    else if(stream->closed) {
      if(stream->resp_hds_complete) {
        /* Server decided to close the stream after having sent us a findl
         * response. This is valid if it is not interested in the request
         * body. This happens on 30x or 40x responses.
         * We silently discard the data sent, since this is not a transport
         * error situation. */
        CURL_TRC_CF(data, cf, "[%d] discarding data"
                    "on closed stream with response", stream->id);
        *err = CURLE_OK;
        nwritten = (ssize_t)len;
        goto out;
      }
      infof(data, "stream %u closed", stream->id);
      *err = CURLE_SEND_ERROR;
      nwritten = -1;
      goto out;
    }
    else {
      /* If stream_id != -1, we have dispatched request HEADERS and
       * optionally request body, and now are going to send or sending
       * more request body in DATA frame */
      nwritten = Curl_bufq_write(&stream->sendbuf, buf, len, err);
      if(nwritten < 0 && *err != CURLE_AGAIN)
        goto out;
    }

    if(!Curl_bufq_is_empty(&stream->sendbuf)) {
      /* req body data is buffered, resume the potentially suspended stream */
      rv = nghttp2_session_resume_data(ctx->h2, stream->id);
      if(nghttp2_is_fatal(rv)) {
        *err = CURLE_SEND_ERROR;
        nwritten = -1;
        goto out;
      }
    }
  }
  else {
    nwritten = h2_submit(&stream, cf, data, buf, len, err);
    if(nwritten < 0) {
      goto out;
    }
    DEBUGASSERT(stream);
  }

  /* Call the nghttp2 send loop and flush to write ALL buffered data,
   * headers and/or request body completely out to the network */
  result = h2_progress_egress(cf, data);
  /* if the stream has been closed in egress handling (nghttp2 does that
   * when it does not like the headers, for example */
  if(stream && stream->closed && !was_blocked) {
    infof(data, "stream %u closed", stream->id);
    *err = CURLE_SEND_ERROR;
    nwritten = -1;
    goto out;
  }
  else if(result == CURLE_AGAIN) {
    blocked = 1;
  }
  else if(result) {
    *err = result;
    nwritten = -1;
    goto out;
  }
  else if(stream && !Curl_bufq_is_empty(&stream->sendbuf)) {
    /* although we wrote everything that nghttp2 wants to send now,
     * there is data left in our stream send buffer unwritten. This may
     * be due to the stream's HTTP/2 flow window being exhausted. */
    blocked = 1;
  }

  if(stream && blocked && nwritten > 0) {
    /* Unable to send all data, due to connection blocked or H2 window
     * exhaustion. Data is left in our stream buffer, or nghttp2's internal
     * frame buffer or our network out buffer. */
    size_t rwin = nghttp2_session_get_stream_remote_window_size(ctx->h2,
                                                                stream->id);
    /* Whatever the cause, we need to return CURL_EAGAIN for this call.
     * We have unwritten state that needs us being invoked again and EAGAIN
     * is the only way to ensure that. */
    stream->upload_blocked_len = nwritten;
    CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) BLOCK: win %u/%zu "
                "blocked_len=%zu",
                stream->id, len,
                nghttp2_session_get_remote_window_size(ctx->h2), rwin,
                nwritten);
    *err = CURLE_AGAIN;
    nwritten = -1;
    goto out;
  }
  else if(should_close_session(ctx)) {
    /* nghttp2 thinks this session is done. If the stream has not been
     * closed, this is an error state for out transfer */
    if(stream->closed) {
      nwritten = http2_handle_stream_close(cf, data, stream, err);
    }
    else {
      CURL_TRC_CF(data, cf, "send: nothing to do in this session");
      *err = CURLE_HTTP2;
      nwritten = -1;
    }
  }

out:
  if(stream) {
    CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) -> %zd, %d, "
                "upload_left=%" CURL_FORMAT_CURL_OFF_T ", "
                "h2 windows %d-%d (stream-conn), "
                "buffers %zu-%zu (stream-conn)",
                stream->id, len, nwritten, *err,
                stream->upload_left,
                nghttp2_session_get_stream_remote_window_size(
                  ctx->h2, stream->id),
                nghttp2_session_get_remote_window_size(ctx->h2),
                Curl_bufq_len(&stream->sendbuf),
                Curl_bufq_len(&ctx->outbufq));
  }
  else {
    CURL_TRC_CF(data, cf, "cf_send(len=%zu) -> %zd, %d, "
                "connection-window=%d, nw_send_buffer(%zu)",
                len, nwritten, *err,
                nghttp2_session_get_remote_window_size(ctx->h2),
                Curl_bufq_len(&ctx->outbufq));
  }
  CF_DATA_RESTORE(cf, save);
  return nwritten;
}